

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O3

ETrdFileName TRD_FileNameToBytes(char *inputName,byte *binName,int *nameL)

{
  int iVar1;
  ETrdFileName EVar2;
  char *pcVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  
  pcVar3 = strrchr(inputName,0x2e);
  iVar8 = (int)pcVar3 - (int)inputName;
  if (7 < iVar8) {
    iVar8 = 8;
  }
  if (pcVar3 == (char *)0x0) {
    iVar8 = 8;
  }
  *nameL = 0;
  bVar7 = *inputName;
  uVar6 = 0;
  if (0 < iVar8 && bVar7 != '\0') {
    uVar6 = 0;
    do {
      binName[uVar6] = bVar7;
      iVar1 = *nameL;
      uVar6 = (long)iVar1 + 1;
      *nameL = (int)uVar6;
      if (iVar8 <= (int)uVar6) break;
      bVar7 = inputName[(long)iVar1 + 1];
    } while (bVar7 != '\0');
    if (6 < iVar1) goto LAB_0011a7de;
  }
  do {
    *nameL = (int)uVar6 + 1;
    binName[(int)uVar6] = ' ';
    uVar6 = (ulong)(uint)*nameL;
  } while (*nameL < 8);
LAB_0011a7de:
  if (((pcVar3 != (char *)0x0) && (bVar7 = pcVar3[1], bVar7 != '\0')) && ((int)uVar6 < 0xb)) {
    pbVar4 = (byte *)(pcVar3 + 2);
    do {
      binName[(int)uVar6] = bVar7;
      iVar8 = *nameL;
      uVar5 = iVar8 + 1;
      uVar6 = (ulong)uVar5;
      *nameL = uVar5;
      bVar7 = *pbVar4;
      if (bVar7 == '\0') break;
      pbVar4 = pbVar4 + 1;
    } while (iVar8 < 10);
  }
  while (uVar5 = (uint)uVar6, (uVar5 | 2) != 0xb) {
    *nameL = uVar5 + 1;
    binName[(int)uVar5] = ' ';
    uVar6 = (ulong)(uint)*nameL;
  }
  memset(binName + (uVar6 & 0xffffffff),0,(ulong)(0xc - uVar5));
  EVar2 = THREE_LETTER_EXTENSION;
  if ((*nameL < 10) &&
     ((0x21 < binName[8] - 0x23 ||
      (EVar2 = OK, (0x380000001U >> ((ulong)(binName[8] - 0x23) & 0x3f) & 1) == 0)))) {
    EVar2 = INVALID_EXTENSION;
  }
  return EVar2;
}

Assistant:

ETrdFileName TRD_FileNameToBytes(const char* inputName, byte binName[12], int & nameL) {
	constexpr int baseSz = int(STrdFile::NAME_BASE_SZ);	// pre-cast to `int` (vs `nameL`)
	const char* ext = strrchr(inputName, '.');
	const int maxL = std::min(baseSz, ext ? int(ext-inputName) : baseSz);
	nameL = 0;
	while (inputName[nameL] && nameL < maxL) {
		binName[nameL] = inputName[nameL];
		++nameL;
	}
	while (nameL < baseSz) binName[nameL++] = ' ';
	while (ext && ext[1] && nameL < int(STrdFile::NAME_ALT_FULL_SZ)) {
		binName[nameL] = ext[1];
		++nameL;
		++ext;
	}
	while (STrdFile::NAME_FULL_SZ != nameL && STrdFile::NAME_ALT_FULL_SZ != nameL) {
		binName[nameL++] = ' ';		// the file name is either 8+1 or 8+3 (not 8+2)
	}
	int fillIdx = nameL;
	while (fillIdx < 12) binName[fillIdx++] = 0;
	if (int(STrdFile::NAME_FULL_SZ) < nameL) return THREE_LETTER_EXTENSION;
	switch (binName[baseSz]) {
		case 'B': case 'C': case 'D': case '#':
			return OK;
	}
	return INVALID_EXTENSION;
}